

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void json_print_templates(json_session *session,abuf_template_data *data,size_t count)

{
  autobuf *autobuf;
  abuf_template_data_entry *paVar1;
  long lVar2;
  abuf_template_data *paVar3;
  size_t sVar4;
  char *s;
  ulong uVar5;
  bool bVar6;
  
  if (session->empty == true) {
    session->empty = false;
    s = "\n";
  }
  else {
    s = ",\n";
  }
  abuf_puts(session->out,s);
  autobuf = session->out;
  bVar6 = true;
  for (sVar4 = 0; sVar4 != count; sVar4 = sVar4 + 1) {
    paVar3 = data + sVar4;
    lVar2 = 0;
    for (uVar5 = 0; uVar5 < paVar3->count; uVar5 = uVar5 + 1) {
      paVar1 = paVar3->data;
      if (*(long *)((long)&paVar1->value + lVar2) != 0) {
        if (!bVar6) {
          abuf_puts(autobuf,",\n");
          paVar1 = paVar3->data;
        }
        bVar6 = false;
        abuf_appendf(autobuf,"\"%s\":",*(undefined8 *)((long)&paVar1->key + lVar2));
        _json_printvalue(autobuf,*(char **)((long)&paVar3->data->value + lVar2),
                         (&paVar3->data->string)[lVar2]);
      }
      lVar2 = lVar2 + 0x18;
    }
  }
  return;
}

Assistant:

void
json_print_templates(struct json_session *session, struct abuf_template_data *data, size_t count) {
  if (session->empty) {
    session->empty = false;
    abuf_puts(session->out, "\n");
  }
  else {
    abuf_puts(session->out, ",\n");
  }

  _add_template(session->out, false, data, count);
}